

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
cfd::core::ConfidentialTransaction::GetTxOutIndexList
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ConfidentialTransaction *this,Script *locking_script)

{
  value_type_conflict1 vVar1;
  __type _Var2;
  bool bVar3;
  size_type sVar4;
  const_reference this_00;
  CfdException *this_01;
  allocator local_e9;
  string local_e8;
  CfdSourceLocation local_c8;
  Script local_b0;
  string local_78;
  value_type_conflict1 local_58 [2];
  uint32_t index;
  undefined1 local_48 [8];
  string search_str;
  Script *locking_script_local;
  ConfidentialTransaction *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  search_str.field_2._M_local_buf[0xf] = '\0';
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  Script::GetHex_abi_cxx11_((string *)local_48,locking_script);
  for (local_58[0] = 0; vVar1 = local_58[0],
      sVar4 = ::std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              size(&this->vout_), vVar1 < (uint)sVar4; local_58[0] = local_58[0] + 1) {
    this_00 = ::std::
              vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
              operator[](&this->vout_,(ulong)local_58[0]);
    AbstractTxOut::GetLockingScript(&local_b0,&this_00->super_AbstractTxOut);
    Script::GetHex_abi_cxx11_(&local_78,&local_b0);
    _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    Script::~Script(&local_b0);
    if (_Var2) {
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,local_58);
    }
  }
  bVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(__return_storage_ptr__);
  if (bVar3) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x5d6;
    local_c8.funcname = "GetTxOutIndexList";
    logger::warn<>(&local_c8,"locking script is not found.");
    this_01 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e8,"locking script is not found.",&local_e9);
    CfdException::CfdException(this_01,kCfdIllegalArgumentError,&local_e8);
    __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
  }
  search_str.field_2._M_local_buf[0xf] = '\x01';
  ::std::__cxx11::string::~string((string *)local_48);
  if ((search_str.field_2._M_local_buf[0xf] & 1U) == 0) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> ConfidentialTransaction::GetTxOutIndexList(
    const Script &locking_script) const {
  std::vector<uint32_t> result;
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    if (search_str == vout_[index].GetLockingScript().GetHex()) {
      result.push_back(index);
    }
  }
  if (result.empty()) {
    warn(CFD_LOG_SOURCE, "locking script is not found.");
    throw CfdException(
        kCfdIllegalArgumentError, "locking script is not found.");
  }
  return result;
}